

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::ValueChangeFunc::~ValueChangeFunc(ValueChangeFunc *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~ValueChangeFunc((ValueChangeFunc *)0x962508);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

ValueChangeFunc(KnownSystemName knownNameId) :
        SystemSubroutine(knownNameId, SubroutineKind::Function) {}